

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar_pidd.hpp
# Opt level: O1

vector<Tiles::State,_std::allocator<Tiles::State>_> * __thiscall
astar_pidd::AStarPIDD<Tiles>::search
          (vector<Tiles::State,_std::allocator<Tiles::State>_> *__return_storage_ptr__,
          AStarPIDD<Tiles> *this,State *init)

{
  size_t *psVar1;
  pointer *ppSVar2;
  undefined8 *puVar3;
  char cVar4;
  int iVar5;
  iterator iVar6;
  void *pvVar7;
  char cVar8;
  char cVar9;
  vector<Tiles::State,std::allocator<Tiles::State>> *this_00;
  int i;
  long lVar10;
  ulong uVar11;
  Tiles *pTVar12;
  ostream *poVar13;
  long lVar14;
  char cVar15;
  ulong uVar16;
  bool bVar17;
  State state;
  Node<Tiles> n;
  value_type n_1;
  Node<Tiles> parent;
  State parent_state;
  State local_ca;
  vector<Tiles::State,std::allocator<Tiles::State>> *local_b8;
  CompressClosedListAsync<Node<Tiles>_> *local_b0;
  vector<Tiles::State,_std::allocator<Tiles::State>_> *local_a8;
  Node<Tiles> local_a0;
  Node<Tiles> local_88;
  Node<Tiles> local_68;
  CompressOpenList<Node<Tiles>_> *local_50;
  State local_42;
  
  lVar10 = 0;
  local_a0.g = '\0';
  local_a0.f = init->h;
  local_a0.pop = -1;
  init->tiles[init->blank] = '\0';
  local_a0.parent_packed.word = 0;
  do {
    local_a0.parent_packed.word = (long)init->tiles[lVar10] | local_a0.parent_packed.word << 4;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x10);
  local_50 = &this->open;
  local_a8 = __return_storage_ptr__;
  local_a0.packed.word = local_a0.parent_packed.word;
  compress::CompressOpenList<Node<Tiles>_>::push(local_50,&local_a0);
  local_b8 = (vector<Tiles::State,std::allocator<Tiles::State>> *)&this->path;
  local_b0 = &this->closed;
  do {
    if (((this->open).size == 0) ||
       ((this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
        super__Vector_impl_data._M_start)) {
      std::vector<Tiles::State,_std::allocator<Tiles::State>_>::vector
                (local_a8,(vector<Tiles::State,_std::allocator<Tiles::State>_> *)local_b8);
      return local_a8;
    }
    collect_unique_nodes((vector<Node<Tiles>,_std::allocator<Node<Tiles>_>_> *)&local_a0,this,0x20);
    compress::CompressClosedListAsync<Node<Tiles>_>::batch_duplicate_detection
              (local_b0,(vector<Node<Tiles>,_std::allocator<Node<Tiles>_>_> *)&local_a0);
    uVar11 = CONCAT53(local_a0._3_5_,CONCAT12(local_a0.pop,CONCAT11(local_a0.g,local_a0.f)));
    bVar17 = local_a0.parent_packed.word != uVar11;
    if (bVar17) {
      uVar16 = 0;
      do {
        local_88.packed.word = *(uint64_t *)(uVar11 + 0x10 + uVar16 * 0x18);
        puVar3 = (undefined8 *)(uVar11 + uVar16 * 0x18);
        local_88._0_8_ = *puVar3;
        local_88.parent_packed.word = puVar3[1];
        Tiles::unpack((this->super_SearchAlg<Tiles>).dom,&local_ca,local_88.packed);
        cVar8 = local_ca.h;
        if (local_ca.h == '\0') {
          iVar6._M_current =
               (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar6._M_current ==
              (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Tiles::State,std::allocator<Tiles::State>>::
            _M_realloc_insert<Tiles::State_const&>(local_b8,iVar6,&local_ca);
          }
          else {
            (iVar6._M_current)->blank = local_ca.blank;
            (iVar6._M_current)->h = local_ca.h;
            *(undefined8 *)(iVar6._M_current)->tiles = local_ca.tiles._0_8_;
            *(undefined8 *)((iVar6._M_current)->tiles + 8) = local_ca.tiles._8_8_;
            ppSVar2 = &(this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppSVar2 = *ppSVar2 + 1;
          }
          this_00 = local_b8;
          if (local_88.packed.word != local_88.parent_packed.word) {
            do {
              compress::CompressClosedListAsync<Node<Tiles>_>::trace_parent
                        (&local_68,local_b0,&local_88);
              Tiles::unpack((this->super_SearchAlg<Tiles>).dom,&local_42,local_68.packed);
              iVar6._M_current =
                   (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              if (iVar6._M_current ==
                  (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<Tiles::State,std::allocator<Tiles::State>>::
                _M_realloc_insert<Tiles::State_const&>(this_00,iVar6,&local_42);
              }
              else {
                (iVar6._M_current)->blank = local_42.blank;
                (iVar6._M_current)->h = local_42.h;
                *(undefined8 *)(iVar6._M_current)->tiles = local_42.tiles._0_8_;
                *(undefined8 *)((iVar6._M_current)->tiles + 8) = local_42.tiles._8_8_;
                ppSVar2 = &(this->path).
                           super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                *ppSVar2 = *ppSVar2 + 1;
              }
              local_88.packed.word = local_68.packed.word;
              local_88.g = local_68.g;
              local_88.f = local_68.f;
              local_88.pop = local_68.pop;
              local_88._3_5_ = local_68._3_5_;
              local_88.parent_packed.word = local_68.parent_packed.word;
            } while (local_68.packed.word != local_68.parent_packed.word);
          }
          compress::CompressClosedListAsync<Node<Tiles>_>::print_statistics(local_b0);
          std::
          _Rb_tree<int,_std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>,_std::_Select1st<std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>_>_>
          ::clear((_Rb_tree<int,_std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>,_std::_Select1st<std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>_>_>
                   *)local_50);
          (this->open).size = 0;
          rmdir("open_list_buckets");
          compress::CompressClosedListAsync<Node<Tiles>_>::clear(local_b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"duplicates ",0xb);
          poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
          std::ostream::put((char)poVar13);
          std::ostream::flush();
          std::vector<Tiles::State,_std::allocator<Tiles::State>_>::vector
                    (local_a8,(vector<Tiles::State,_std::allocator<Tiles::State>_> *)local_b8);
        }
        else {
          psVar1 = &(this->super_SearchAlg<Tiles>).expd;
          *psVar1 = *psVar1 + 1;
          pTVar12 = (this->super_SearchAlg<Tiles>).dom;
          lVar10 = (long)local_ca.blank;
          if (0 < *(int *)(pTVar12 + lVar10 * 0x14 + 0x4440)) {
            lVar14 = 0;
            cVar15 = local_ca.blank;
            do {
              iVar5 = *(int *)(pTVar12 + lVar14 * 4 + lVar10 * 0x14 + 0x4444);
              if (iVar5 != local_88.pop) {
                psVar1 = &(this->super_SearchAlg<Tiles>).gend;
                *psVar1 = *psVar1 + 1;
                cVar9 = local_ca.h;
                cVar4 = local_ca.tiles[iVar5];
                local_ca.tiles[lVar10] = cVar4;
                local_ca.h = local_ca.h +
                             (char)pTVar12[(long)local_ca.blank * 4 +
                                           (long)cVar4 * 0x400 + (long)iVar5 * 0x40 + 0x440];
                local_ca.blank = (char)iVar5;
                local_68.g = local_88.g + '\x01';
                local_68.f = local_88.g + '\x01' + local_ca.h;
                local_68.pop = cVar15;
                local_68.packed.word = 0;
                local_ca.tiles[(char)iVar5] = '\0';
                lVar10 = 0;
                local_68.packed.word = 0;
                do {
                  local_68.packed.word = (long)local_ca.tiles[lVar10] | local_68.packed.word << 4;
                  lVar10 = lVar10 + 1;
                } while (lVar10 != 0x10);
                local_68.parent_packed.word = local_88.packed.word;
                compress::CompressOpenList<Node<Tiles>_>::push(local_50,&local_68);
                local_ca.h = cVar9;
                local_ca.tiles[local_ca.blank] = local_ca.tiles[cVar15];
                local_ca.blank = cVar15;
              }
              lVar14 = lVar14 + 1;
              pTVar12 = (this->super_SearchAlg<Tiles>).dom;
              lVar10 = (long)local_ca.blank;
              cVar15 = local_ca.blank;
            } while (lVar14 < *(int *)(pTVar12 + lVar10 * 0x14 + 0x4440));
          }
        }
        if (cVar8 == '\0') break;
        uVar16 = uVar16 + 1;
        uVar11 = CONCAT53(local_a0._3_5_,CONCAT12(local_a0.pop,CONCAT11(local_a0.g,local_a0.f)));
        bVar17 = uVar16 < (ulong)(((long)(local_a0.parent_packed.word - uVar11) >> 3) *
                                 -0x5555555555555555);
      } while (bVar17);
    }
    pvVar7 = (void *)CONCAT53(local_a0._3_5_,CONCAT12(local_a0.pop,CONCAT11(local_a0.g,local_a0.f)))
    ;
    if (pvVar7 != (void *)0x0) {
      operator_delete(pvVar7);
    }
    if (bVar17) {
      return local_a8;
    }
  } while( true );
}

Assistant:

std::vector<typename Domain::State>
        search(typename Domain::State &init) {
            open.push(wrap(init, nullptr, 0, -1));

            while (!open.isempty() && path.size() == 0) {
                // temporary placeholder for intermediate reopenings
                std::vector<Node<Domain> > reopened_nodes;

                auto nodes = collect_unique_nodes(N_THREADS);
                
                closed.batch_duplicate_detection(nodes);
                               
                for (std::size_t i = 0; i < nodes.size(); ++i) {
                    auto n = nodes[i];
                    
                    typename Domain::State state;
                    this->dom.unpack(state, n.packed);

                    if (this->dom.isgoal(state)) {
                        // trace path here
                        path.push_back(state);
                        while(n.packed != n.parent_packed) {
                            Node<Domain> parent = closed.trace_parent(n);
                            typename Domain::State parent_state;
                            this->dom.unpack(parent_state, parent.packed);
                            path.push_back(parent_state);
                            n = parent;
                        }
                        closed.print_statistics();
                        open.clear();
                        closed.clear();
                        std::cout << "duplicates " << duplicates << std::endl;
                        return path;
                    }

                    this->expd++;
                    for (int i = 0; i < this->dom.nops(state); i++) {
                        int op = this->dom.nthop(state, i);
                        if (op == n.pop)
                            continue;
                        this->gend++;
                        Edge<Domain> e = this->dom.apply(state, op);
                        open.push(wrap(state, &n, e.cost, e.pop));
                        this->dom.undo(state, e);
                    }
                }
            }
            return path;
        }